

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O0

void __thiscall ActionMergeAdjacent::ActionMergeAdjacent(ActionMergeAdjacent *this,string *g)

{
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *g_local;
  ActionMergeAdjacent *this_local;
  
  local_18 = g;
  g_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"mergeadjacent",&local_39);
  Action::Action(&this->super_Action,8,(string *)local_38,local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__ActionMergeAdjacent_00855570;
  return;
}

Assistant:

ActionMergeAdjacent(const string &g) : Action(rule_onceperfunc,"mergeadjacent",g) {}